

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int __thiscall
opengv::absolute_pose::modules::GpnpOptimizationFunctor::operator()
          (GpnpOptimizationFunctor *this,VectorXd *x,VectorXd *fvec)

{
  Matrix<double,_12,_1,_0,_12,_1> *pMVar1;
  ulong uVar2;
  pointer pMVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  ResScalar RVar12;
  ResScalar RVar13;
  points_t ccam;
  Vector3d diffw;
  Vector3d diffc;
  Matrix<double,_12,_1,_0,_12,_1> solution;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_198;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_180;
  double *local_168 [2];
  double *local_158;
  long local_150;
  Matrix<double,_12,_12,_0,_12,_12> *local_140;
  undefined8 local_138;
  long local_130;
  undefined8 local_128;
  Matrix<double,_3,_1,_0,_3,_1> local_118;
  double local_100;
  double dStack_f8;
  double dStack_f0;
  double dStack_e8;
  undefined1 auStack_e0 [32];
  undefined1 auStack_c0 [32];
  
  pMVar1 = this->_a;
  lVar5 = 0x480;
  uVar8 = 0;
  local_100 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[0];
  dStack_f8 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[1];
  dStack_f0 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[2];
  dStack_e8 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[3];
  auStack_c0 = SUB6432(*(undefined1 (*) [64])
                        ((pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).
                         m_storage.m_data.array + 4),0x20);
  auStack_e0 = *(undefined1 (*) [32])
                ((pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
                 m_data.array + 4);
  while( true ) {
    uVar2 = this->_dim;
    if (uVar2 <= uVar8) break;
    local_140 = this->_V;
    local_130 = (uVar8 - uVar2) + 0xc;
    local_158 = (double *)
                (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                [uVar8];
    local_150 = (long)local_140 + lVar5 + uVar2 * -0x60;
    local_138 = 0;
    local_128 = 0xc;
    Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_100,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_12,_12,_0,_12,_12>,_12,_1,_true>_>_>
                *)local_168);
    uVar8 = uVar8 + 1;
    lVar5 = lVar5 + 0x60;
  }
  pdVar9 = &local_100;
  local_180._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_180._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 3) {
    local_158 = &local_100;
    local_140 = (Matrix<double,_12,_12,_0,_12,_12> *)0xc;
    local_168[0] = pdVar9;
    local_150 = lVar5;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,3,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_118,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_3,_1,_false>_> *)
               local_168);
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_180,&local_118);
    pdVar9 = pdVar9 + 3;
  }
  lVar5 = 0x18;
  lVar11 = 0;
  lVar4 = 0;
  lVar7 = lVar5;
  while (lVar4 != 3) {
    lVar10 = lVar11;
    for (lVar6 = lVar7; lVar6 != 0x60; lVar6 = lVar6 + 0x18) {
      pMVar3 = (this->_c->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_198.m_lhs = pMVar3 + lVar4;
      local_198.m_rhs =
           (RhsNested)
           ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data + lVar6);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)local_168,&local_198);
      local_198.m_lhs = local_180._M_impl.super__Vector_impl_data._M_start + lVar4;
      local_198.m_rhs =
           (RhsNested)
           ((long)((local_180._M_impl.super__Vector_impl_data._M_start)->
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                  array + lVar6);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                (&local_118,&local_198);
      RVar12 = Eigen::internal::
               dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
               ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_168,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_168);
      RVar13 = Eigen::internal::
               dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
               ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_118,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_118);
      *(double *)
       ((long)(fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data + lVar10) = RVar12 - RVar13;
      lVar10 = lVar10 + 8;
    }
    lVar11 = lVar11 + lVar5;
    lVar7 = lVar7 + 0x18;
    lVar5 = lVar5 + -8;
    lVar4 = lVar4 + 1;
  }
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_180);
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == _dim );
    assert( (unsigned int) fvec.size() == 6);

    Eigen::Matrix<double,12,1> solution = _a;
    for(size_t i = 0; i < _dim; i++)
      solution += x[i]*_V.col(12-_dim+i);

    points_t ccam;
    for(size_t i = 0; i<4; i++)
      ccam.push_back(solution.block<3,1>(i*3,0));

    Eigen::Vector3d diffw;
    Eigen::Vector3d diffc;
    size_t index = 0;

    for(size_t i = 0; i<3; i++)
    {
      for(size_t j = i+1; j < 4; j++)
      {
        diffw = _c[i]-_c[j];
        diffc = ccam[i]-ccam[j];
        fvec[index++] = diffw.dot(diffw)-diffc.dot(diffc);
      }
    }

    return 0;
  }